

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_doc *
duckdb_yyjson::yyjson_read_file
          (char *path,yyjson_read_flag flg,yyjson_alc *alc_ptr,yyjson_read_err *err)

{
  FILE *__stream;
  yyjson_doc *pyVar1;
  yyjson_read_err *err_00;
  yyjson_read_err *pyVar2;
  yyjson_read_err dummy_err;
  yyjson_read_err local_48;
  
  err_00 = err;
  if (err == (yyjson_read_err *)0x0) {
    err_00 = &local_48;
  }
  if (path == (char *)0x0) {
    pyVar2 = &local_48;
    if (err != (yyjson_read_err *)0x0) {
      pyVar2 = err;
    }
    pyVar2->pos = 0;
    pyVar2->msg = "input path is NULL";
    err_00->code = 1;
  }
  else {
    __stream = fopen(path,"rbe");
    if (__stream != (FILE *)0x0) {
      pyVar1 = yyjson_read_fp((FILE *)__stream,flg,alc_ptr,err_00);
      fclose(__stream);
      return pyVar1;
    }
    pyVar2 = &local_48;
    if (err != (yyjson_read_err *)0x0) {
      pyVar2 = err;
    }
    pyVar2->pos = 0;
    pyVar2->msg = "file opening failed";
    err_00->code = 0xc;
  }
  return (yyjson_doc *)0x0;
}

Assistant:

yyjson_doc *yyjson_read_file(const char *path,
                             yyjson_read_flag flg,
                             const yyjson_alc *alc_ptr,
                             yyjson_read_err *err) {
#define return_err(_code, _msg) do { \
    err->pos = 0; \
    err->msg = _msg; \
    err->code = YYJSON_READ_ERROR_##_code; \
    return NULL; \
} while (false)

    yyjson_read_err dummy_err;
    yyjson_doc *doc;
    FILE *file;

    if (!err) err = &dummy_err;
    if (unlikely(!path)) return_err(INVALID_PARAMETER, "input path is NULL");

    file = fopen_readonly(path);
    if (unlikely(!file)) return_err(FILE_OPEN, "file opening failed");

    doc = yyjson_read_fp(file, flg, alc_ptr, err);
    fclose(file);
    return doc;

#undef return_err
}